

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize2.h
# Opt level: O1

void stbir__horizontal_gather_7_channels_with_n_coeffs_mod0
               (float *output_buffer,uint output_sub_size,float *decode_buffer,
               stbir__contributors *horizontal_contributors,float *horizontal_coefficients,
               int coefficient_width)

{
  float *pfVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  int iVar6;
  float *pfVar7;
  long lVar8;
  float *pfVar9;
  float *pfVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  
  pfVar1 = output_buffer + output_sub_size * 7;
  pfVar7 = horizontal_coefficients + 4;
  do {
    lVar8 = (long)(horizontal_contributors->n0 * 7);
    pfVar9 = decode_buffer + lVar8;
    fVar18 = *horizontal_coefficients;
    fVar26 = horizontal_coefficients[1];
    fVar19 = horizontal_coefficients[2];
    fVar2 = horizontal_coefficients[3];
    fVar11 = pfVar9[0xe] * fVar19 + *pfVar9 * fVar18;
    fVar12 = pfVar9[0xf] * fVar19 + pfVar9[1] * fVar18;
    fVar13 = pfVar9[0x10] * fVar19 + pfVar9[2] * fVar18;
    fVar14 = pfVar9[0x11] * fVar19 + pfVar9[3] * fVar18;
    fVar15 = pfVar9[0x11] * fVar19 + pfVar9[3] * fVar18;
    fVar16 = pfVar9[0x12] * fVar19 + pfVar9[4] * fVar18;
    fVar17 = pfVar9[0x13] * fVar19 + pfVar9[5] * fVar18;
    fVar18 = pfVar9[0x14] * fVar19 + pfVar9[6] * fVar18;
    fVar19 = pfVar9[0x15] * fVar2 + pfVar9[7] * fVar26;
    fVar20 = pfVar9[0x16] * fVar2 + pfVar9[8] * fVar26;
    fVar21 = pfVar9[0x17] * fVar2 + pfVar9[9] * fVar26;
    fVar22 = pfVar9[0x18] * fVar2 + pfVar9[10] * fVar26;
    fVar23 = pfVar9[0x18] * fVar2 + fVar26 * pfVar9[10];
    fVar24 = pfVar9[0x19] * fVar2 + fVar26 * pfVar9[0xb];
    fVar25 = pfVar9[0x1a] * fVar2 + fVar26 * pfVar9[0xc];
    fVar26 = pfVar9[0x1b] * fVar2 + fVar26 * pfVar9[0xd];
    pfVar9 = decode_buffer + lVar8 + 0x1c;
    iVar6 = (horizontal_contributors->n1 - horizontal_contributors->n0 >> 2) + 1;
    pfVar10 = pfVar7;
    do {
      fVar2 = *pfVar10;
      fVar3 = pfVar10[1];
      fVar4 = pfVar10[2];
      fVar5 = pfVar10[3];
      fVar11 = pfVar9[0xe] * fVar4 + *pfVar9 * fVar2 + fVar11;
      fVar12 = pfVar9[0xf] * fVar4 + pfVar9[1] * fVar2 + fVar12;
      fVar13 = pfVar9[0x10] * fVar4 + pfVar9[2] * fVar2 + fVar13;
      fVar14 = pfVar9[0x11] * fVar4 + pfVar9[3] * fVar2 + fVar14;
      fVar15 = pfVar9[0x11] * fVar4 + pfVar9[3] * fVar2 + fVar15;
      fVar16 = pfVar9[0x12] * fVar4 + pfVar9[4] * fVar2 + fVar16;
      fVar17 = pfVar9[0x13] * fVar4 + pfVar9[5] * fVar2 + fVar17;
      fVar18 = pfVar9[0x14] * fVar4 + pfVar9[6] * fVar2 + fVar18;
      fVar19 = pfVar9[0x15] * fVar5 + pfVar9[7] * fVar3 + fVar19;
      fVar20 = pfVar9[0x16] * fVar5 + pfVar9[8] * fVar3 + fVar20;
      fVar21 = pfVar9[0x17] * fVar5 + pfVar9[9] * fVar3 + fVar21;
      fVar22 = pfVar9[0x18] * fVar5 + pfVar9[10] * fVar3 + fVar22;
      fVar23 = pfVar9[0x18] * fVar5 + fVar3 * pfVar9[10] + fVar23;
      fVar24 = pfVar9[0x19] * fVar5 + fVar3 * pfVar9[0xb] + fVar24;
      fVar25 = pfVar9[0x1a] * fVar5 + fVar3 * pfVar9[0xc] + fVar25;
      fVar26 = pfVar9[0x1b] * fVar5 + fVar3 * pfVar9[0xd] + fVar26;
      pfVar9 = pfVar9 + 0x1c;
      iVar6 = iVar6 + -1;
      pfVar10 = pfVar10 + 4;
    } while (1 < iVar6);
    output_buffer[3] = fVar15 + fVar23;
    output_buffer[4] = fVar16 + fVar24;
    output_buffer[5] = fVar17 + fVar25;
    output_buffer[6] = fVar18 + fVar26;
    *output_buffer = fVar11 + fVar19;
    output_buffer[1] = fVar12 + fVar20;
    output_buffer[2] = fVar13 + fVar21;
    output_buffer[3] = fVar14 + fVar22;
    horizontal_coefficients = horizontal_coefficients + coefficient_width;
    horizontal_contributors = horizontal_contributors + 1;
    output_buffer = output_buffer + 7;
    pfVar7 = pfVar7 + coefficient_width;
  } while (output_buffer < pfVar1);
  return;
}

Assistant:

static void STBIR_chans( stbir__horizontal_gather_,_channels_with_n_coeffs_mod0 )( float * output_buffer, unsigned int output_sub_size, float const * decode_buffer, stbir__contributors const * horizontal_contributors, float const * horizontal_coefficients, int coefficient_width )
{
  float const * output_end = output_buffer + output_sub_size * STBIR__horizontal_channels;
  float STBIR_SIMD_STREAMOUT_PTR( * ) output = output_buffer;
  STBIR_SIMD_NO_UNROLL_LOOP_START
  do {
    float const * decode = decode_buffer + horizontal_contributors->n0 * STBIR__horizontal_channels;
    int n = ( ( horizontal_contributors->n1 - horizontal_contributors->n0 + 1 ) - 4 + 3 ) >> 2;
    float const * hc = horizontal_coefficients;

    stbir__4_coeff_start();
    STBIR_SIMD_NO_UNROLL_LOOP_START
    do {
      hc += 4;
      decode += STBIR__horizontal_channels * 4;
      stbir__4_coeff_continue_from_4( 0 );
      --n;
    } while ( n > 0 );
    stbir__store_output();
  } while ( output < output_end );
}